

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O0

void start_output_tga(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  FILE *__stream;
  j_decompress_ptr in_RSI;
  long *in_RDI;
  FILE *outfile;
  int i;
  int num_colors;
  tga_dest_ptr dest;
  int local_20;
  int in_stack_ffffffffffffffe4;
  int num_colors_00;
  j_decompress_ptr cinfo_00;
  
  if ((int)in_RDI[8] == 1) {
    write_header(in_RSI,(djpeg_dest_ptr)in_RSI,in_stack_ffffffffffffffe4);
    if (*(int *)((long)in_RDI + 0x6c) == 0) {
      in_RSI->mem = (jpeg_memory_mgr *)put_gray_rows;
    }
    else {
      in_RSI->mem = (jpeg_memory_mgr *)put_demapped_gray;
    }
  }
  else if ((int)in_RDI[8] == 2) {
    if (*(int *)((long)in_RDI + 0x6c) == 0) {
      write_header(in_RSI,(djpeg_dest_ptr)in_RSI,in_stack_ffffffffffffffe4);
      in_RSI->mem = (jpeg_memory_mgr *)put_pixel_rows;
    }
    else {
      num_colors_00 = *(int *)((long)in_RDI + 0x9c);
      cinfo_00 = in_RSI;
      if (0x100 < num_colors_00) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x413;
        *(int *)(*in_RDI + 0x2c) = num_colors_00;
        (**(code **)*in_RDI)(in_RDI);
      }
      write_header(cinfo_00,(djpeg_dest_ptr)in_RSI,num_colors_00);
      __stream = *(FILE **)&in_RSI->is_decompressor;
      for (local_20 = 0; local_20 < num_colors_00; local_20 = local_20 + 1) {
        putc((uint)*(byte *)(*(long *)(in_RDI[0x14] + 0x10) + (long)local_20),__stream);
        putc((uint)*(byte *)(*(long *)(in_RDI[0x14] + 8) + (long)local_20),__stream);
        putc((uint)*(byte *)(*(long *)in_RDI[0x14] + (long)local_20),__stream);
      }
      in_RSI->mem = (jpeg_memory_mgr *)put_gray_rows;
    }
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x40e;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
start_output_tga(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  int num_colors, i;
  FILE *outfile;

  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    /* Targa doesn't have a mapped grayscale format, so we will */
    /* demap quantized gray output.  Never emit a colormap. */
    write_header(cinfo, dinfo, 0);
    if (cinfo->quantize_colors)
      dest->pub.put_pixel_rows = put_demapped_gray;
    else
      dest->pub.put_pixel_rows = put_gray_rows;
  } else if (cinfo->out_color_space == JCS_RGB) {
    if (cinfo->quantize_colors) {
      /* We only support 8-bit colormap indexes, so only 256 colors */
      num_colors = cinfo->actual_number_of_colors;
      if (num_colors > 256)
        ERREXIT1(cinfo, JERR_TOO_MANY_COLORS, num_colors);
      write_header(cinfo, dinfo, num_colors);
      /* Write the colormap.  Note Targa uses BGR byte order */
      outfile = dest->pub.output_file;
      for (i = 0; i < num_colors; i++) {
        putc(cinfo->colormap[2][i], outfile);
        putc(cinfo->colormap[1][i], outfile);
        putc(cinfo->colormap[0][i], outfile);
      }
      dest->pub.put_pixel_rows = put_gray_rows;
    } else {
      write_header(cinfo, dinfo, 0);
      dest->pub.put_pixel_rows = put_pixel_rows;
    }
  } else {
    ERREXIT(cinfo, JERR_TGA_COLORSPACE);
  }
}